

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

wstring * __thiscall
mjs::property_name_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,expression *e)

{
  int iVar1;
  long lVar2;
  mjs *this_00;
  long lVar3;
  
  this_00 = this;
  iVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if ((iVar1 != 0) &&
     ((iVar1 = (**(code **)(*(long *)this + 0x18))(this), iVar1 != 2 ||
      (1 < *(int *)(this + 0x20) - 3U)))) {
    __assert_fail("is_valid_property_name_expression(e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x95,"std::wstring mjs::property_name_string(const expression &)");
  }
  iVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar3 = *(long *)(this + 0x20);
    lVar2 = *(long *)(this + 0x28);
  }
  else {
    if (*(int *)(this + 0x20) == 3) {
      number_to_string_abi_cxx11_(__return_storage_ptr__,this_00,*(double *)(this + 0x28));
      return __return_storage_ptr__;
    }
    if (*(int *)(this + 0x20) != 4) {
      __assert_fail("lt.type() == token_type::numeric_literal",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                    ,0x9d,"std::wstring mjs::property_name_string(const expression &)");
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar3 = *(long *)(this + 0x28);
    lVar2 = *(long *)(this + 0x30);
  }
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)__return_storage_ptr__,lVar3,lVar3 + lVar2 * 4);
  return __return_storage_ptr__;
}

Assistant:

std::wstring property_name_string(const expression& e) {
    assert(is_valid_property_name_expression(e));
    if (e.type() == expression_type::identifier) {
        return static_cast<const identifier_expression&>(e).id();
    }
    const auto& lt = static_cast<const literal_expression&>(e).t();
    if (lt.type() == token_type::string_literal) {
        return lt.text();
    } else {
        assert(lt.type() == token_type::numeric_literal);
        return number_to_string(lt.dvalue());
    }
}